

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_trainer.cc
# Opt level: O2

Status __thiscall
sentencepiece::SentencePieceNormalizer::Normalize
          (SentencePieceNormalizer *this,string_view input,string *normalized,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *norm_to_orig)

{
  long *plVar1;
  ostringstream local_188 [376];
  
  plVar1 = *(long **)(input._M_len + 8);
  if (plVar1 == (long *)0x0) {
    std::__cxx11::ostringstream::ostringstream(local_188);
    std::operator<<((ostream *)local_188,"third_party/sentencepiece/src/sentencepiece_trainer.cc");
    std::operator<<((ostream *)local_188,"(");
    std::ostream::operator<<(local_188,0x15f);
    std::operator<<((ostream *)local_188,") [");
    std::operator<<((ostream *)local_188,"normalizer_");
    std::operator<<((ostream *)local_188,"] ");
    util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this);
    std::__cxx11::ostringstream::~ostringstream(local_188);
  }
  else {
    (**(code **)(*plVar1 + 0x20))(this,plVar1,input._M_str);
  }
  return (unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
          )(unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
            )this;
}

Assistant:

util::Status SentencePieceNormalizer::Normalize(
    absl::string_view input, std::string *normalized,
    std::vector<size_t> *norm_to_orig) const {
  CHECK_OR_RETURN(normalizer_);
  return normalizer_->Normalize(input, normalized, norm_to_orig);
}